

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O1

double * r8mat_mtv_new(int m,int n,double *a,double *x)

{
  double *pdVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  
  uVar2 = 0xffffffffffffffff;
  if (-1 < n) {
    uVar2 = (long)n * 8;
  }
  pdVar1 = (double *)operator_new__(uVar2);
  if (0 < n) {
    uVar2 = 0;
    do {
      pdVar1[uVar2] = 0.0;
      if (0 < m) {
        dVar4 = pdVar1[uVar2];
        uVar3 = 0;
        do {
          dVar4 = dVar4 + a[uVar3] * x[uVar3];
          uVar3 = uVar3 + 1;
        } while ((uint)m != uVar3);
        pdVar1[uVar2] = dVar4;
      }
      uVar2 = uVar2 + 1;
      a = a + (uint)m;
    } while (uVar2 != (uint)n);
  }
  return pdVar1;
}

Assistant:

double *r8mat_mtv_new ( int m, int n, double a[], double x[] )

//****************************************************************************80
//
//  Purpose:
//
//    R8MAT_MTV_NEW multiplies a transposed matrix times a vector.
//
//  Discussion:
//
//    An R8MAT is a doubly dimensioned array of R8 values, stored as a vector
//    in column-major order.
//
//    For this routine, the result is returned as the function value.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    11 April 2007
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int M, N, the number of rows and columns of the matrix.
//
//    Input, double A[M,N], the M by N matrix.
//
//    Input, double X[M], the vector to be multiplied by A.
//
//    Output, double R8MAT_MTV_NEW[N], the product A'*X.
//
{
  int i;
  int j;
  double *y;

  y = new double[n];

  for ( j = 0; j < n; j++ )
  {
    y[j] = 0.0;
    for ( i = 0; i < m; i++ )
    {
      y[j] = y[j] + a[i+j*m] * x[i];
    }
  }

  return y;
}